

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O3

void __thiscall cfdcapi_psbt_GetPsbtInput_Test::TestBody(cfdcapi_psbt_GetPsbtInput_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *in_R9;
  char *tx;
  char *fingerprint;
  int ret;
  char *value;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  void *pubkey_list_handle;
  char *path;
  void *handle;
  void *psbt_handle;
  uint32_t txin_index;
  uint32_t list_num;
  uint32_t vout;
  char *txid;
  char *script;
  AssertHelper local_c8;
  AssertHelper local_c0;
  int local_b4;
  AssertHelper local_b0;
  AssertHelper local_a8;
  string local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  void *local_60;
  AssertHelper local_58;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t local_44;
  char *local_40;
  char *local_38;
  
  local_60 = (void *)0x0;
  local_b4 = CfdCreateHandle(&local_60);
  local_80.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_80.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.ptr_._0_1_ = local_60 != (void *)0x0;
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 == (void *)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_80,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d9,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (local_c0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_c0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.data_ = (AssertHelperData *)0x0;
  pcVar3 = "";
  local_b4 = CfdCreatePsbtHandle(local_60,1,
                                 "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
                                 ,"",0,0,&local_58.data_);
  local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3e0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b4 == 0) {
    local_4c = 0;
    local_40 = (char *)0x0;
    local_44 = 0;
    local_38 = (char *)0x0;
    local_b4 = CfdGetPsbtUtxoDataByIndex
                         (local_60,local_58.data_,0,&local_40,&local_44,(int64_t *)0x0,(char **)0x0,
                          &local_38,(char **)0x0,(char **)0x0);
    local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,1000,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,
                 "\"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69\"","txid",
                 "544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",local_40);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ea,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_a0,"0","vout",(int *)&local_80,&local_44);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3eb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,
                 "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
                 ,"script",
                 "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
                 ,local_38);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ec,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdGetPsbtTxInIndex(local_60,local_58.data_,local_40,local_44,&local_4c);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3ef,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_a0,"0","txin_index",(int *)&local_80,&local_4c);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3f0,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68.data_ = (AssertHelperData *)0x0;
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      local_a8.data_ = (AssertHelperData *)0x0;
      local_c8.data_ = (AssertHelperData *)0x0;
      local_b4 = CfdGetPsbtUtxoData(local_60,local_58.data_,local_40,local_44,(int64_t *)&local_68,
                                    (char **)&local_70,(char **)0x0,(char **)&local_a8,
                                    (char **)&local_c8);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3f7,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_b4 == 0) {
        local_80.ptr_._0_4_ = 0x1dcd5808;
        testing::internal::CmpHelperEQ<int,long>
                  ((internal *)&local_a0,"499996680","amount",(int *)&local_80,(long *)&local_68);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3f9,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_a0,"\"a914945fb50391a70637c1ffc5ab7fb65308c2f2317587\"",
                   "locking_script","a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",
                   (char *)local_70.ptr_);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fa,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_a0,
                   "\"sh(wsh(multi(2,[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))\""
                   ,"descriptor",
                   "sh(wsh(multi(2,[2a704760/44\'/0\'/0\'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44\'/0\'/0\'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))"
                   ,(char *)local_a8.data_);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fb,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_c8.data_;
        local_c0.data_ = (AssertHelperData *)0x0;
        testing::internal::CmpHelperEQ<char*,char*>
                  ((internal *)&local_a0,"nullptr","tx",(char **)&local_c0,(char **)&local_80);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fc,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b4 = CfdFreeStringBuffer((char *)local_70.ptr_);
        local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3fe,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
        local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x400,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b4 = CfdFreeStringBuffer((char *)local_c8.data_);
        local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
        if ((char)local_a0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_a0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x402,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      local_b4 = CfdFreeStringBuffer(local_40);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x406,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer(local_38);
      local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_80);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x408,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_b4 = CfdIsFindPsbtPubkeyRecord
                         (local_60,local_58.data_,1,local_4c,
                          "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3");
    local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x40d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_b4 = CfdGetPsbtPubkeyRecord
                         (local_60,local_58.data_,1,local_4c,
                          "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                          (char **)&local_80);
    local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c0);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x412,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_c0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c0.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,
                 "\"3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401\""
                 ,"signature",
                 "3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401"
                 ,(char *)local_80.ptr_);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x414,pcVar3);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer((char *)local_80.ptr_);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x416,pcVar3);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_c0.data_ = (AssertHelperData *)0x0;
    local_68.data_ = (AssertHelperData *)0x0;
    local_b4 = CfdGetPsbtBip32Data(local_60,local_58.data_,2,local_4c,
                                   "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3"
                                   ,(char **)&local_c0,(char **)&local_68);
    local_70.ptr_ = local_70.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x41c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,"\"2a704760\"","fingerprint","2a704760",
                 (char *)local_c0.data_);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x41e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_70.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",
                 (char *)local_68.data_);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x41f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_70.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer((char *)local_c0.data_);
      local_70.ptr_ = local_70.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x421,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_70.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer((char *)local_68.data_);
      local_70.ptr_ = local_70.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x423,pcVar3);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_70.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48 = 0;
    local_b4 = CfdGetPsbtPubkeyList(local_60,local_58.data_,1,local_4c,&local_48,&local_70.ptr_);
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x429,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      uVar2 = 0;
      local_a8.data_ = (AssertHelperData *)0x0;
      local_c0.data_ = (AssertHelperData *)0x0;
      local_68.data_ = (AssertHelperData *)0x0;
      if (local_48 != 0) {
        do {
          local_b4 = CfdGetPsbtPubkeyListData
                               (local_60,local_70.ptr_,uVar2,(char **)&local_a8,(char **)0x0);
          local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c8);
            pcVar3 = "";
            if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
              pcVar3 = *(char **)local_a0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x430,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_b4 == 0) {
            if (uVar2 == 1) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"",
                         "pk","03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x435,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else if (uVar2 == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"",
                         "pk","03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x433,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x438,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_a8.data_ = (AssertHelperData *)0x0;
          }
          local_b4 = CfdGetPsbtPubkeyListBip32Data
                               (local_60,local_70.ptr_,uVar2,(char **)&local_a8,(char **)&local_c0,
                                (char **)&local_68);
          local_c8.data_._0_4_ = 1;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_a0,"kCfdIllegalArgumentError","ret",
                     (CfdErrorCode *)&local_c8,&local_b4);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c8);
            pcVar3 = "";
            if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
              pcVar3 = *(char **)local_a0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x43c,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_b4 == 0) {
            local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x43f,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_a8.data_ = (AssertHelperData *)0x0;
            local_b4 = CfdFreeStringBuffer((char *)local_c0.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x442,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_c0.data_ = (AssertHelperData *)0x0;
            local_b4 = CfdFreeStringBuffer((char *)local_68.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x445,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_68.data_ = (AssertHelperData *)0x0;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_48);
      }
      local_b4 = CfdFreePsbtPubkeyList(local_60,local_70.ptr_);
      local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x44a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48 = 0;
    local_b4 = CfdGetPsbtPubkeyList(local_60,local_58.data_,2,local_4c,&local_48,&local_70.ptr_);
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x451,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      uVar2 = 0;
      local_a8.data_ = (AssertHelperData *)0x0;
      local_c0.data_ = (AssertHelperData *)0x0;
      local_68.data_ = (AssertHelperData *)0x0;
      if (local_48 != 0) {
        do {
          local_b4 = CfdGetPsbtPubkeyListData
                               (local_60,local_70.ptr_,uVar2,(char **)&local_a8,(char **)0x0);
          local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c8);
            pcVar3 = "";
            if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
              pcVar3 = *(char **)local_a0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x458,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_b4 == 0) {
            if (uVar2 == 1) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"",
                         "pk","03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x45d,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else if (uVar2 == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"",
                         "pk","03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x45b,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x460,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_a8.data_ = (AssertHelperData *)0x0;
          }
          local_b4 = CfdGetPsbtPubkeyListBip32Data
                               (local_60,local_70.ptr_,uVar2,(char **)&local_a8,(char **)&local_c0,
                                (char **)&local_68);
          local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
          if ((char)local_a0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_c8);
            pcVar3 = "";
            if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
              pcVar3 = *(char **)local_a0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x464,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          CfdcapiPsbtDumpLog(local_b4,local_60);
          if (local_b4 == 0) {
            if (uVar2 == 1) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"",
                         "pk","03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x46c,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,"\"9d6b6d86\"","fingerprint","9d6b6d86",
                         (char *)local_c0.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x46d,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",
                         (char *)local_68.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x46e,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else if (uVar2 == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,
                         "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"",
                         "pk","03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
                         (char *)local_a8.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x468,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,"\"2a704760\"","fingerprint","2a704760",
                         (char *)local_c0.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x469,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_a0,"\"44\'/0\'/0\'/0/11\"","path","44\'/0\'/0\'/0/11",
                         (char *)local_68.data_);
              if ((char)local_a0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_c8);
                pcVar3 = "";
                if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                  pcVar3 = *(char **)local_a0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                           ,0x46a,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if (local_c8.data_ != (AssertHelperData *)0x0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_c8.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x471,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_a8.data_ = (AssertHelperData *)0x0;
            local_b4 = CfdFreeStringBuffer((char *)local_c0.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x474,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_c0.data_ = (AssertHelperData *)0x0;
            local_b4 = CfdFreeStringBuffer((char *)local_68.data_);
            local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4
                      );
            if ((char)local_a0._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_c8);
              pcVar3 = "";
              if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
                pcVar3 = *(char **)local_a0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x477,pcVar3);
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if (local_c8.data_ != (AssertHelperData *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_c8.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_68.data_ = (AssertHelperData *)0x0;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_48);
      }
      local_b4 = CfdFreePsbtPubkeyList(local_60,local_70.ptr_);
      local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x47c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_b4 = CfdIsFindPsbtRecord(local_60,local_58.data_,2,0,"01");
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x480,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a8.data_ = (AssertHelperData *)0x0;
    local_b4 = CfdGetPsbtRecord(local_60,local_58.data_,2,0,"01",(char **)&local_a8);
    local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x484,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,
                 "\"0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587\"","value",
                 "0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587",
                 (char *)local_a8.data_);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x486,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
      local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x489,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8.data_ = (AssertHelperData *)0x0;
    }
    local_b4 = CfdIsFindPsbtRecord(local_60,local_58.data_,2,0,"99");
    local_c8.data_._0_4_ = 8;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdNotFoundError","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x490,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b4 = CfdAddPsbtRecord(local_60,local_58.data_,2,0,"99","0011223344");
    local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x493,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b4 = CfdIsFindPsbtRecord(local_60,local_58.data_,2,0,"99");
    local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x496,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a8.data_ = (AssertHelperData *)0x0;
    local_b4 = CfdGetPsbtRecord(local_60,local_58.data_,2,0,"99",(char **)&local_a8);
    local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x49a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_b4 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_a0,"exp_unknown_value","value","0011223344",
                 (char *)local_a8.data_);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x49c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b4 = CfdFreeStringBuffer((char *)local_a8.data_);
      local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
      if ((char)local_a0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c8);
        if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_a0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x49f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8.data_ = (AssertHelperData *)0x0;
    }
    local_b4 = CfdFreePsbtHandle(local_60,local_58.data_);
    local_c8.data_ = local_c8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_c8,&local_b4);
    if ((char)local_a0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_a0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4a4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_a0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_b4 = CfdFreeHandle(local_60);
  local_80.ptr_ = local_80.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_a0,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_b4);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4a8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_psbt, GetPsbtInput) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* psbt_base64 = "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==";
  ret = CfdCreatePsbtHandle(
    handle, net_type, psbt_base64, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    uint32_t txin_index = 0;

    char* txid = nullptr;
    uint32_t vout = 0;
    char* script = nullptr;
    ret = CfdGetPsbtUtxoDataByIndex(handle, psbt_handle, 0, &txid, &vout, nullptr, nullptr, &script, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69", txid);
      EXPECT_EQ(0, vout);
      EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", script);

      ret = CfdGetPsbtTxInIndex(handle, psbt_handle, txid, vout, &txin_index);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(0, txin_index);

      int64_t amount = 0;
      char* locking_script = nullptr;
      char* descriptor = nullptr;
      char* tx = nullptr;
      ret = CfdGetPsbtUtxoData(handle, psbt_handle, txid, vout, &amount, &locking_script, nullptr, &descriptor, &tx);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(499996680, amount);
        EXPECT_STREQ("a914945fb50391a70637c1ffc5ab7fb65308c2f2317587", locking_script);
        EXPECT_STREQ("sh(wsh(multi(2,[2a704760/44'/0'/0'/0/11]03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3,[9d6b6d86/44'/0'/0'/0/11]03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47)))", descriptor);
        EXPECT_EQ(nullptr, tx);
        ret = CfdFreeStringBuffer(locking_script);
        EXPECT_EQ(kCfdSuccess, ret);
        ret = CfdFreeStringBuffer(descriptor);
        EXPECT_EQ(kCfdSuccess, ret);
        ret = CfdFreeStringBuffer(tx);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdFreeStringBuffer(txid);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(script);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    const char* pubkey = "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3";
    ret = CfdIsFindPsbtPubkeyRecord(handle, psbt_handle, kCfdPsbtRecordInputSignature, txin_index, pubkey);
    EXPECT_EQ(kCfdSuccess, ret);

    char* signature = nullptr;
    ret = CfdGetPsbtPubkeyRecord(handle, psbt_handle,
        kCfdPsbtRecordInputSignature, txin_index, pubkey, &signature);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("3044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401", signature);
      ret = CfdFreeStringBuffer(signature);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* fingerprint = nullptr;
    char* path = nullptr;
    ret = CfdGetPsbtBip32Data(handle, psbt_handle, kCfdPsbtRecordInputBip32, txin_index, pubkey, &fingerprint, &path);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2a704760", fingerprint);
      EXPECT_STREQ("44'/0'/0'/0/11", path);
      ret = CfdFreeStringBuffer(fingerprint);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(path);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    void* pubkey_list_handle = nullptr;
    uint32_t list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordInputSignature,
        txin_index, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdIllegalArgumentError, ret);
        if (ret == kCfdSuccess) {
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    pubkey_list_handle = nullptr;
    list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordInputBip32,
        txin_index, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3", pk);
            EXPECT_STREQ("2a704760", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/11", path);
          } else if (index == 1) {
            EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47", pk);
            EXPECT_STREQ("9d6b6d86", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/11", path);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, "01");
    EXPECT_EQ(kCfdSuccess, ret);

    char* value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, "01", &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587", value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    const char* unknown_key = "99";
    const char* exp_unknown_value = "0011223344";
    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key);
    EXPECT_EQ(kCfdNotFoundError, ret);

    ret = CfdAddPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key, exp_unknown_value);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key);
    EXPECT_EQ(kCfdSuccess, ret);

    value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeInput, 0, unknown_key, &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_unknown_value, value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}